

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O0

rc_size __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int iVar1;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> pcVar2;
  undefined1 auVar3 [16];
  rc_size rVar4;
  bool bVar5;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar6;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar7;
  type piVar8;
  type pfVar9;
  type prVar10;
  float fVar11;
  undefined1 local_50 [4];
  float a;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  float sum_a_p;
  float sum_a_pi;
  int c_size;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  *this_local;
  
  sum_a_pi = 0.0;
  sum_a_p = 0.0;
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    ht.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._4_4_ =
         0.0;
    ht.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._0_4_ =
         0.0;
    sparse_matrix<int>::column((sparse_matrix<int> *)local_50,(int)this + 0x10);
    while( true ) {
      ppcVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      pcVar2 = *ppcVar6;
      ppcVar7 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      if (pcVar2 == *ppcVar7) break;
      ppcVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         (&this->A,(long)(*ppcVar6)->value);
      iVar1 = *piVar8;
      ppcVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar6)->row);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)*pfVar9),ZEXT416((uint)(float)iVar1),
                               ZEXT416((uint)ht.
                                             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                                             .
                                             super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>
                                             ._M_head_impl._4_4_));
      ht.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._4_4_ =
           auVar3._0_4_;
      ppcVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->P,(long)(*ppcVar6)->value);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)*pfVar9),ZEXT416((uint)(float)iVar1),
                               ZEXT416((uint)ht.
                                             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                                             .
                                             super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>
                                             ._M_head_impl._0_4_));
      ht.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._0_4_ =
           auVar3._0_4_;
      ppcVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      *ppcVar6 = *ppcVar6 + 1;
    }
    prVar10 = std::
              unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
              ::operator[](&this->R,(long)(int)sum_a_pi);
    prVar10->id = (int)sum_a_pi;
    fVar11 = default_cost_type<float>::operator()(this->c,end_local->column,x);
    fVar11 = (fVar11 - ht.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                       _M_head_impl._4_4_) -
             ht.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl.
             _0_4_;
    prVar10 = std::
              unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
              ::operator[](&this->R,(long)(int)sum_a_pi);
    prVar10->value = fVar11;
    piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->A,(long)end_local->value);
    iVar1 = *piVar8;
    prVar10 = std::
              unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
              ::operator[](&this->R,(long)(int)sum_a_pi);
    prVar10->f = iVar1;
    prVar10 = std::
              unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
              ::operator[](&this->R,(long)(int)sum_a_pi);
    bVar5 = rc_data::is_negative_factor(prVar10);
    if (bVar5) {
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                ::operator[](&this->R,(long)(int)sum_a_pi);
      fVar11 = prVar10->value;
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                ::operator[](&this->R,(long)(int)sum_a_pi);
      prVar10->value = -fVar11;
      sum_a_p = (float)((int)sum_a_p + 1);
    }
    sum_a_pi = (float)((int)sum_a_pi + 1);
  }
  rVar4.c_size = (int)sum_a_p;
  rVar4.r_size = (int)sum_a_pi;
  return rVar4;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A[std::get<0>(ht)->value]);

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A[begin->value];

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }